

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

void ebur128_check_true_peak(ebur128_state *st,size_t frames)

{
  double *pdVar1;
  size_t sVar2;
  double local_48;
  double local_40;
  double val;
  size_t frames_out;
  size_t i;
  size_t c;
  size_t frames_local;
  ebur128_state *st_local;
  
  sVar2 = interp_process(st->d->interp,frames,st->d->resampler_buffer_input,
                         st->d->resampler_buffer_output);
  for (frames_out = 0; frames_out < sVar2; frames_out = frames_out + 1) {
    for (i = 0; i < st->channels; i = i + 1) {
      local_48 = (double)st->d->resampler_buffer_output[frames_out * st->channels + i];
      local_40 = local_48;
      if (local_48 <= -local_48) {
        local_40 = -local_48;
      }
      pdVar1 = st->d->prev_true_peak + i;
      if (*pdVar1 <= local_40 && local_40 != *pdVar1) {
        if (local_48 <= -local_48) {
          local_48 = -local_48;
        }
        st->d->prev_true_peak[i] = local_48;
      }
    }
  }
  return;
}

Assistant:

static void ebur128_check_true_peak(ebur128_state* st, size_t frames) {
  size_t c, i, frames_out;

  frames_out =
      interp_process(st->d->interp, frames, st->d->resampler_buffer_input,
                     st->d->resampler_buffer_output);

  for (i = 0; i < frames_out; ++i) {
    for (c = 0; c < st->channels; ++c) {
      double val =
          (double) st->d->resampler_buffer_output[i * st->channels + c];

      if (EBUR128_MAX(val, -val) > st->d->prev_true_peak[c]) {
        st->d->prev_true_peak[c] = EBUR128_MAX(val, -val);
      }
    }
  }
}